

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *path;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string dir;
  
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (!bVar1) {
    pcVar2 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)lg);
    std::__cxx11::string::string((string *)&local_78,pcVar2,&local_99);
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)lg);
    std::__cxx11::string::string((string *)&local_98,pcVar2,&local_9a);
    cmOutputConverter::ConvertToRelativePath
              (&local_58,
               &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_78,&local_98);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&dir,(cmSystemTools *)local_58._M_dataplus._M_p,path);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
    poVar3 = std::operator<<(ruleFileStream,"# Directory level rules for directory ");
    poVar3 = std::operator<<(poVar3,(string *)&dir);
    std::operator<<(poVar3,"\n\n");
    WriteDirectoryRule2(this,ruleFileStream,lg,"all",true,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"preinstall",true,true);
    std::__cxx11::string::~string((string *)&dir);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir = cmSystemTools::ConvertToOutputPath(
    lg->ConvertToRelativePath(lg->GetBinaryDirectory(),
                              lg->GetCurrentBinaryDirectory())
      .c_str());
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}